

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenubar.cpp
# Opt level: O2

void __thiscall QDBusMenuBar::unregisterMenuBar(QDBusMenuBar *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  WId WVar6;
  undefined4 extraout_var;
  long *plVar7;
  undefined8 uVar8;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QDBusError local_160;
  QArrayDataPointer<char16_t> local_120;
  QArrayDataPointer<char> local_108;
  QDBusError local_f0;
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<char> local_98;
  char local_80 [24];
  char *local_68;
  QDBusPendingReply<> r;
  undefined1 *local_58;
  undefined1 *puStack_50;
  QDBusConnection connection;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _connection = &DAT_aaaaaaaaaaaaaaaa;
  QDBusConnection::sessionBus();
  bVar3 = QPointer::operator_cast_to_bool((QPointer *)(this + 0x28));
  if (bVar3) {
    QGuiApplication::platformName();
    local_160.code = NoMemory;
    local_160._4_4_ = 0;
    local_160.msg.d.d = (Data *)0x5d00da;
    bVar3 = ::operator==((QString *)&local_f0,(QLatin1StringView *)&local_160);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f0);
    if (bVar3) {
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      latin1.m_data = "com.canonical.AppMenu.Registrar";
      latin1.m_size = 0x1f;
      QString::QString((QString *)&local_f0,latin1);
      latin1_00.m_data = "/com/canonical/AppMenu/Registrar";
      latin1_00.m_size = 0x20;
      QString::QString((QString *)&local_160,latin1_00);
      QDBusMenuRegistrarInterface::QDBusMenuRegistrarInterface
                ((QDBusMenuRegistrarInterface *)&local_58,(QString *)&local_f0,(QString *)&local_160
                 ,&connection,(QObject *)this);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_160);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f0);
      r.super_QDBusPendingReplyBase = (QDBusPendingReplyBase)&DAT_aaaaaaaaaaaaaaaa;
      WVar6 = QWindow::winId(*(QWindow **)(this + 0x30));
      QDBusMenuRegistrarInterface::UnregisterWindow
                (&r,(QDBusMenuRegistrarInterface *)&local_58,(uint)WVar6);
      QDBusPendingCall::waitForFinished();
      cVar4 = QDBusPendingCall::isError();
      if (cVar4 != '\0') {
        local_80[0] = '\x02';
        local_80[1] = '\0';
        local_80[2] = '\0';
        local_80[3] = '\0';
        local_80[0x14] = '\0';
        local_80[0x15] = '\0';
        local_80[0x16] = '\0';
        local_80[0x17] = '\0';
        local_80[4] = '\0';
        local_80[5] = '\0';
        local_80[6] = '\0';
        local_80[7] = '\0';
        local_80[8] = '\0';
        local_80[9] = '\0';
        local_80[10] = '\0';
        local_80[0xb] = '\0';
        local_80[0xc] = '\0';
        local_80[0xd] = '\0';
        local_80[0xe] = '\0';
        local_80[0xf] = '\0';
        local_80[0x10] = '\0';
        local_80[0x11] = '\0';
        local_80[0x12] = '\0';
        local_80[0x13] = '\0';
        local_68 = "default";
        QDBusPendingCall::error();
        QDBusError::name();
        QString::toUtf8_helper((QString *)&local_98);
        if (local_98.ptr == (char *)0x0) {
          local_98.ptr = (char *)&QByteArray::_empty;
        }
        QDBusPendingCall::error();
        QDBusError::message();
        QString::toUtf8_helper((QString *)&local_108);
        if (local_108.ptr == (char *)0x0) {
          local_108.ptr = (char *)&QByteArray::_empty;
        }
        QMessageLogger::warning
                  (local_80,"Failed to unregister window menu, reason: %s (\"%s\")",local_98.ptr,
                   local_108.ptr);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_108);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
        QDBusError::~QDBusError(&local_160);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
        QDBusError::~QDBusError(&local_f0);
      }
      QDBusPendingReplyBase::~QDBusPendingReplyBase(&r.super_QDBusPendingReplyBase);
      QDBusMenuRegistrarInterface::~QDBusMenuRegistrarInterface
                ((QDBusMenuRegistrarInterface *)&local_58);
    }
    iVar5 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0x13])();
    if (CONCAT44(extraout_var,iVar5) == 0) {
      plVar7 = (long *)0x0;
    }
    else {
      plVar7 = (long *)__dynamic_cast(CONCAT44(extraout_var,iVar5),&QPlatformServices::typeinfo,
                                      &QDesktopUnixServices::typeinfo,0);
    }
    lVar2 = *(long *)(this + 0x28);
    if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
      uVar8 = 0;
    }
    else {
      uVar8 = *(undefined8 *)(this + 0x30);
    }
    (**(code **)(*plVar7 + 0x48))(plVar7,uVar8);
  }
  if (*(long *)(this + 0x48) != 0) {
    QDBusConnection::unregisterObject(&connection,this + 0x38,0);
  }
  QDBusConnection::~QDBusConnection(&connection);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusMenuBar::unregisterMenuBar()
{
    QDBusConnection connection = QDBusConnection::sessionBus();

    if (m_window) {
        if (QGuiApplication::platformName() == "xcb"_L1) {
            QDBusMenuRegistrarInterface registrar(REGISTRAR_SERVICE, REGISTRAR_PATH, connection, this);
            QDBusPendingReply<> r = registrar.UnregisterWindow(m_window->winId());
            r.waitForFinished();
            if (r.isError())
                qWarning("Failed to unregister window menu, reason: %s (\"%s\")",
                         qUtf8Printable(r.error().name()), qUtf8Printable(r.error().message()));
        }

        const auto unixServices = dynamic_cast<QDesktopUnixServices *>(
            QGuiApplicationPrivate::platformIntegration()->services());
        unixServices->unregisterDBusMenuForWindow(m_window);
    }

    if (!m_objectPath.isEmpty()) {
        connection.unregisterObject(m_objectPath);
    }
}